

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O1

base_learner * kernel_svm_setup(options_i *options,vw *all)

{
  size_type *psVar1;
  bool bVar2;
  vw *pvVar3;
  options_i *poVar4;
  int iVar5;
  svm_params *__s;
  option_group_definition *poVar6;
  typed_option<unsigned_long> *ptVar7;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar8;
  typed_option<float> *ptVar9;
  typed_option<int> *ptVar10;
  loss_function *plVar11;
  svm_model *psVar12;
  svm_example **ppsVar13;
  ulong uVar14;
  ostream *poVar15;
  double *pdVar16;
  long *plVar17;
  int *piVar18;
  learner<svm_params,_example> *plVar19;
  vw_ostream *pvVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  double dVar23;
  bool ksvm;
  free_ptr<svm_params> params;
  int degree;
  float bandwidth;
  string kernel_type;
  option_group_definition new_options;
  string loss_function;
  bool local_e89;
  free_ptr<svm_params> local_e88;
  int local_e78;
  float local_e74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  options_i *local_e50;
  undefined1 *local_e48 [2];
  undefined1 local_e38 [16];
  undefined1 *local_e28 [2];
  undefined1 local_e18 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08;
  string local_de8;
  undefined1 *local_dc8 [2];
  undefined1 local_db8 [16];
  string local_da8;
  undefined1 *local_d88 [2];
  undefined1 local_d78 [16];
  string local_d68;
  undefined1 *local_d48 [2];
  undefined1 local_d38 [16];
  string local_d28;
  undefined1 *local_d08 [2];
  undefined1 local_cf8 [16];
  string local_ce8;
  undefined1 *local_cc8 [2];
  undefined1 local_cb8 [16];
  string local_ca8;
  undefined1 *local_c88 [2];
  undefined1 local_c78 [16];
  string local_c68;
  undefined1 *local_c48;
  long local_c40;
  undefined1 local_c38 [16];
  option_group_definition local_c28;
  string local_bf0;
  undefined1 *local_bd0 [2];
  undefined1 local_bc0 [16];
  string local_bb0;
  string local_b90;
  undefined1 local_b70 [112];
  bool local_b00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ae8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ad8;
  typed_option<unsigned_long> local_ad0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a30;
  undefined1 local_990 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  undefined1 local_8f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  typed_option<int> local_850;
  typed_option<int> local_7b0;
  typed_option<float> local_710;
  typed_option<float> local_670;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d0;
  typed_option<unsigned_long> local_530;
  typed_option<unsigned_long> local_490;
  typed_option<unsigned_long> local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<bool> local_2b0;
  typed_option<bool> local_210;
  typed_option<unsigned_long> local_170;
  typed_option<bool> local_d0;
  
  __s = calloc_or_throw<svm_params>(1);
  memset(__s,0,0x90);
  local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<svm_params>;
  local_e70._M_dataplus._M_p = (pointer)&local_e70.field_2;
  local_e70._M_string_length = 0;
  local_e70.field_2._M_local_buf[0] = '\0';
  local_e74 = 1.0;
  local_e78 = 2;
  local_e89 = false;
  local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.super__Head_base<0UL,_svm_params_*,_false>.
  _M_head_impl = __s;
  local_c48 = local_c38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c48,"Kernel SVM","");
  local_c28.m_name._M_dataplus._M_p = (pointer)&local_c28.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c28,local_c48,local_c48 + local_c40);
  local_c28.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c28.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c28.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_c48 != local_c38) {
    operator_delete(local_c48);
  }
  local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c68,"ksvm","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_b70,&local_c68,&local_e89);
  local_b00 = true;
  local_c88[0] = local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"kernel svm","");
  std::__cxx11::string::_M_assign((string *)(local_b70 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_b70);
  poVar6 = VW::config::option_group_definition::add<bool>(&local_c28,&local_d0);
  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"reprocess","");
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_ad0,&local_ca8,
             &(local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->reprocess);
  ptVar7 = VW::config::typed_option<unsigned_long>::default_value(&local_ad0,1);
  local_cc8[0] = local_cb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc8,"number of reprocess steps for LASVM","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_170,ptVar7);
  poVar6 = VW::config::option_group_definition::add<unsigned_long>(poVar6,&local_170);
  local_ce8._M_dataplus._M_p = (pointer)&local_ce8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce8,"pool_greedy","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_8f0,&local_ce8,
             &(local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active_pool_greedy);
  local_d08[0] = local_cf8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d08,"use greedy selection on mini pools","");
  std::__cxx11::string::_M_assign((string *)(local_8f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_8f0);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_210);
  local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"para_active","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_990,&local_d28,
             &(local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->para_active);
  local_d48[0] = local_d38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d48,"do parallel active learning","");
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_990);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_2b0);
  local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d68,"pool_size","");
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_3f0,&local_d68,
             &(local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size);
  ptVar7 = VW::config::typed_option<unsigned_long>::default_value(&local_3f0,1);
  local_d88[0] = local_d78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d88,"size of pools for active learning","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_350,ptVar7);
  poVar6 = VW::config::option_group_definition::add<unsigned_long>(poVar6,&local_350);
  local_da8._M_dataplus._M_p = (pointer)&local_da8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_da8,"subsample","");
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_530,&local_da8,
             &(local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->subsample);
  ptVar7 = VW::config::typed_option<unsigned_long>::default_value(&local_530,1);
  local_dc8[0] = local_db8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dc8,"number of items to subsample from the pool","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_490,ptVar7);
  poVar6 = VW::config::option_group_definition::add<unsigned_long>(poVar6,&local_490);
  local_de8._M_dataplus._M_p = (pointer)&local_de8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_de8,"kernel","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_a30,&local_de8,&local_e70);
  local_a30.super_base_option.m_keep = true;
  local_e08._M_dataplus._M_p = (pointer)&local_e08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e08,"linear","");
  ptVar8 = VW::config::
           typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::default_value(&local_a30,&local_e08);
  local_e28[0] = local_e18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e28,"type of kernel (rbf or linear (default))","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_5d0,ptVar8);
  poVar6 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar6,&local_5d0);
  local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b90,"bandwidth","");
  VW::config::typed_option<float>::typed_option(&local_710,&local_b90,&local_e74);
  local_710.super_base_option.m_keep = true;
  ptVar9 = VW::config::typed_option<float>::default_value(&local_710,1.0);
  local_e48[0] = local_e38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e48,"bandwidth of rbf kernel","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_670,ptVar9);
  poVar6 = VW::config::option_group_definition::add<float>(poVar6,&local_670);
  local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"degree","");
  VW::config::typed_option<int>::typed_option(&local_850,&local_bb0,&local_e78);
  local_850.super_base_option.m_keep = true;
  local_e50 = options;
  ptVar10 = VW::config::typed_option<int>::default_value(&local_850,2);
  local_bd0[0] = local_bc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bd0,"degree of poly kernel","");
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_7b0,ptVar10);
  VW::config::option_group_definition::add<int>(poVar6,&local_7b0);
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cfe38;
  if (local_7b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_bd0[0] != local_bc0) {
    operator_delete(local_bd0[0]);
  }
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cfe38;
  if (local_850.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_850.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
    operator_delete(local_bb0._M_dataplus._M_p);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf648;
  if (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_e48[0] != local_e38) {
    operator_delete(local_e48[0]);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf648;
  if (local_710.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
    operator_delete(local_b90._M_dataplus._M_p);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf568;
  if (local_5d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_e28[0] != local_e18) {
    operator_delete(local_e28[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08._M_dataplus._M_p != &local_e08.field_2) {
    operator_delete(local_e08._M_dataplus._M_p);
  }
  local_a30.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf568;
  if (local_a30.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_a30.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_a30.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_de8._M_dataplus._M_p != &local_de8.field_2) {
    operator_delete(local_de8._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_490.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_dc8[0] != local_db8) {
    operator_delete(local_dc8[0]);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_530.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da8._M_dataplus._M_p != &local_da8.field_2) {
    operator_delete(local_da8._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_350.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_d88[0] != local_d78) {
    operator_delete(local_d88[0]);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_3f0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
    operator_delete(local_d68._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_d48[0] != local_d38) {
    operator_delete(local_d48[0]);
  }
  local_990._0_8_ = &PTR__typed_option_002cf500;
  if (local_8f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8f8._M_pi);
  }
  if (local_908._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_908._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
    operator_delete(local_d28._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_d08[0] != local_cf8) {
    operator_delete(local_d08[0]);
  }
  local_8f0._0_8_ = &PTR__typed_option_002cf500;
  if (local_858._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_858._M_pi);
  }
  if (local_868._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_868._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
    operator_delete(local_ce8._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_cc8[0] != local_cb8) {
    operator_delete(local_cc8[0]);
  }
  local_ad0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_ad0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_ad0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_ad0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
    operator_delete(local_ca8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_c88[0] != local_c78) {
    operator_delete(local_c88[0]);
  }
  poVar4 = local_e50;
  local_b70._0_8_ = &PTR__typed_option_002cf500;
  if (local_ad8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ad8._M_pi);
  }
  if (local_ae8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ae8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_b70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p);
  }
  (**poVar4->_vptr_options_i)(poVar4,&local_c28);
  if (local_e89 == false) {
    plVar19 = (learner<svm_params,_example> *)0x0;
  }
  else {
    local_b70._0_8_ = local_b70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"hinge","");
    if (all->loss != (loss_function *)0x0) {
      (*all->loss->_vptr_loss_function[9])();
    }
    local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_bf0,local_b70._0_8_,(pointer)(local_b70._8_8_ + local_b70._0_8_));
    plVar11 = getLossFunction(all,&local_bf0,0.0);
    all->loss = plVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
      operator_delete(local_bf0._M_dataplus._M_p);
    }
    psVar12 = calloc_or_throw<svm_model>(1);
    (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->model = psVar12;
    psVar12->num_support = 0;
    (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->maxcache = 0x40000000;
    (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->loss_sum = 0.0;
    (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all = all;
    if (all->active == true) {
      (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active = true;
    }
    if ((local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active == true) {
      (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active_c = 1.0;
    }
    ppsVar13 = calloc_or_throw<svm_example*>
                         ((local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size);
    (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool = ppsVar13;
    (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_pos = 0;
    psVar1 = &local_ad0.super_base_option.m_name._M_string_length;
    local_ad0.super_base_option._vptr_base_option = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"subsample","");
    iVar5 = (*poVar4->_vptr_options_i[1])(poVar4,&local_ad0);
    if ((char)iVar5 == '\0') {
      bVar2 = (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->para_active;
      if (local_ad0.super_base_option._vptr_base_option != (_func_int **)psVar1) {
        operator_delete(local_ad0.super_base_option._vptr_base_option);
      }
      if (bVar2 != false) {
        uVar14 = (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size /
                 all->all_reduce->total;
        auVar22._8_4_ = (int)(uVar14 >> 0x20);
        auVar22._0_8_ = uVar14;
        auVar22._12_4_ = 0x45300000;
        dVar23 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0);
        uVar14 = (ulong)dVar23;
        (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->subsample =
             (long)(dVar23 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
      }
    }
    else if (local_ad0.super_base_option._vptr_base_option != (_func_int **)psVar1) {
      operator_delete(local_ad0.super_base_option._vptr_base_option);
    }
    uVar21 = -(uint)(all->l2_lambda == 0.0);
    (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->lambda =
         (float)(~uVar21 & (uint)all->l2_lambda | uVar21 & 0x3f800000);
    std::__ostream_insert<char,std::char_traits<char>>
              (&((local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->trace_message).
                super_ostream,"Lambda = ",9);
    poVar15 = std::ostream::_M_insert<double>
                        ((double)(local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>
                                  ._M_t.super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->lambda);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    pvVar20 = &(local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->trace_message;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream,"Kernel = ",9);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (&pvVar20->super_ostream,local_e70._M_dataplus._M_p,
                         local_e70._M_string_length);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    iVar5 = std::__cxx11::string::compare((char *)&local_e70);
    if (iVar5 == 0) {
      (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                (&((local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->trace_message).
                  super_ostream,"bandwidth = ",0xc);
      poVar15 = std::ostream::_M_insert<double>((double)local_e74);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      pdVar16 = calloc_or_throw<double>(1);
      (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_params = pdVar16;
      *(float *)pdVar16 = local_e74;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_e70);
      if (iVar5 == 0) {
        (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 2;
        pvVar20 = &(local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>(&pvVar20->super_ostream,"degree = ",9);
        plVar17 = (long *)std::ostream::operator<<(pvVar20,local_e78);
        std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
        std::ostream::put((char)plVar17);
        std::ostream::flush();
        piVar18 = calloc_or_throw<int>(1);
        (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_params = piVar18;
        *piVar18 = local_e78;
      }
      else {
        (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 0;
      }
    }
    pvVar3 = (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
              super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all;
    if ((pvVar3->weights).sparse == true) {
      sparse_parameters::stride_shift(&(pvVar3->weights).sparse_weights,0);
    }
    else {
      (pvVar3->weights).dense_weights._stride_shift = 0;
    }
    plVar19 = LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
                        (&local_e88,learn,predict,1);
    *(code **)(plVar19 + 0x80) = save_load;
    *(undefined8 *)(plVar19 + 0x70) = *(undefined8 *)(plVar19 + 0x18);
    *(undefined8 *)(plVar19 + 0x78) = *(undefined8 *)(plVar19 + 0x20);
    *(undefined8 *)(plVar19 + 0xb8) = *(undefined8 *)(plVar19 + 0x18);
    *(undefined8 *)(plVar19 + 0xc0) = *(undefined8 *)(plVar19 + 0x20);
    *(code **)(plVar19 + 200) = finish;
    if ((undefined1 *)local_b70._0_8_ != local_b70 + 0x10) {
      operator_delete((void *)local_b70._0_8_);
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_c28.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28.m_name._M_dataplus._M_p != &local_c28.m_name.field_2) {
    operator_delete(local_c28.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
    operator_delete(local_e70._M_dataplus._M_p);
  }
  if (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_svm_params_*,_false>._M_head_impl != (svm_params *)0x0) {
    (*(code *)local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_e88._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar19;
}

Assistant:

LEARNER::base_learner* kernel_svm_setup(options_i& options, vw& all)
{
  auto params = scoped_calloc_or_throw<svm_params>();
  std::string kernel_type;
  float bandwidth = 1.f;
  int degree = 2;

  bool ksvm = false;

  option_group_definition new_options("Kernel SVM");
  new_options.add(make_option("ksvm", ksvm).keep().help("kernel svm"))
      .add(make_option("reprocess", params->reprocess).default_value(1).help("number of reprocess steps for LASVM"))
      .add(make_option("pool_greedy", params->active_pool_greedy).help("use greedy selection on mini pools"))
      .add(make_option("para_active", params->para_active).help("do parallel active learning"))
      .add(make_option("pool_size", params->pool_size).default_value(1).help("size of pools for active learning"))
      .add(make_option("subsample", params->subsample)
               .default_value(1)
               .help("number of items to subsample from the pool"))
      .add(make_option("kernel", kernel_type)
               .keep()
               .default_value("linear")
               .help("type of kernel (rbf or linear (default))"))
      .add(make_option("bandwidth", bandwidth).keep().default_value(1.f).help("bandwidth of rbf kernel"))
      .add(make_option("degree", degree).keep().default_value(2).help("degree of poly kernel"));
  options.add_and_parse(new_options);

  if (!ksvm)
  {
    return nullptr;
  }

  string loss_function = "hinge";
  float loss_parameter = 0.0;
  delete all.loss;
  all.loss = getLossFunction(all, loss_function, (float)loss_parameter);

  params->model = &calloc_or_throw<svm_model>();
  params->model->num_support = 0;
  params->maxcache = 1024 * 1024 * 1024;
  params->loss_sum = 0.;
  params->all = &all;

  // This param comes from the active reduction.
  // During options refactor: this changes the semantics a bit - now this will only be true if --active was supplied and
  // NOT --simulation
  if (all.active)
    params->active = true;
  if (params->active)
    params->active_c = 1.;

  params->pool = calloc_or_throw<svm_example*>(params->pool_size);
  params->pool_pos = 0;

  if (!options.was_supplied("subsample") && params->para_active)
    params->subsample = (size_t)ceil(params->pool_size / all.all_reduce->total);

  params->lambda = all.l2_lambda;
  if (params->lambda == 0.)
    params->lambda = 1.;
  params->all->trace_message << "Lambda = " << params->lambda << endl;
  params->all->trace_message << "Kernel = " << kernel_type << endl;

  if (kernel_type.compare("rbf") == 0)
  {
    params->kernel_type = SVM_KER_RBF;
    params->all->trace_message << "bandwidth = " << bandwidth << endl;
    params->kernel_params = &calloc_or_throw<double>();
    *((float*)params->kernel_params) = bandwidth;
  }
  else if (kernel_type.compare("poly") == 0)
  {
    params->kernel_type = SVM_KER_POLY;
    params->all->trace_message << "degree = " << degree << endl;
    params->kernel_params = &calloc_or_throw<int>();
    *((int*)params->kernel_params) = degree;
  }
  else
    params->kernel_type = SVM_KER_LIN;

  params->all->weights.stride_shift(0);

  learner<svm_params, example>& l = init_learner(params, learn, predict, 1);
  l.set_save_load(save_load);
  l.set_finish(finish);
  return make_base(l);
}